

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int remove(char *__filename)

{
  _List *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  char cVar3;
  int extraout_EAX;
  ostream *poVar4;
  int *piVar5;
  undefined8 *in_RSI;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  path local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  path imageDir;
  path imagePath;
  
  __return_storage_ptr__ = &imageDir._M_cmpts;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,
                 "/images");
  std::filesystem::__cxx11::path::path
            ((path *)local_88,(string_type *)__return_storage_ptr__,auto_format);
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*in_RSI;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI[1];
  do {
    if (__lhs == pbVar1) {
      std::filesystem::__cxx11::path::~path((path *)local_88);
      return extraout_EAX;
    }
    std::operator+(&local_a8,__lhs,".tar.gz");
    std::filesystem::__cxx11::path::path(&local_d0,&local_a8,auto_format);
    std::filesystem::__cxx11::operator/((path *)__return_storage_ptr__,(path *)local_88,&local_d0);
    std::filesystem::__cxx11::path::~path(&local_d0);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar2 = std::filesystem::exists((path *)__return_storage_ptr__);
    if (bVar2) {
      cVar3 = std::filesystem::remove((path *)__return_storage_ptr__);
      if (cVar3 == '\0') {
        poVar4 = std::operator<<((ostream *)&std::cout,"Failed to remove image with ID ");
        poVar4 = std::operator<<(poVar4,(string *)__lhs);
        poVar4 = std::operator<<(poVar4,": [Errno ");
        piVar5 = __errno_location();
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
        pcVar6 = "]";
        goto LAB_0010b42a;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Removed image with ID ");
      poVar4 = std::operator<<(poVar4,(string *)__lhs);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"Image with ID ");
      poVar4 = std::operator<<(poVar4,(string *)__lhs);
      pcVar6 = " does not exist";
LAB_0010b42a:
      poVar4 = std::operator<<(poVar4,pcVar6);
    }
    std::endl<char,std::char_traits<char>>(poVar4);
    std::filesystem::__cxx11::path::~path((path *)__return_storage_ptr__);
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void remove(const std::string& rootDir, const std::vector<std::string>& imageIds)
{
    std::filesystem::path imageDir(rootDir + "/images");
    for (const auto& imageId : imageIds)
    {
        auto imagePath = imageDir / (imageId + ".tar.gz");
        if (!std::filesystem::exists(imagePath))
        {
            std::cout << "Image with ID " << imageId << " does not exist" << std::endl;
        }
        else
        {
            if (std::filesystem::remove(imagePath))
                std::cout << "Removed image with ID " << imageId << std::endl;
            else
                std::cout << "Failed to remove image with ID " << imageId << ": [Errno " << errno << "]" << std::endl;
        }
    }
}